

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,int>
          (TryCast *this,string_t input,int32_t *result,bool strict)

{
  char *pcVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  undefined4 *puVar5;
  char cVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 *puVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  idx_t iVar13;
  byte bVar14;
  ulong uVar15;
  undefined4 *puVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 *puVar20;
  undefined4 *puVar21;
  undefined4 *puVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  IntegerCastData<short> local_76;
  undefined4 local_74;
  undefined4 *local_70;
  IntegerDecimalCastData<int> local_68;
  undefined4 *local_50;
  int local_44;
  string_t input_local;
  
  puVar9 = input.value._8_8_;
  pcVar12 = input.value._0_8_;
  uVar7 = SUB84(result,0);
  pcVar17 = pcVar12;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar17 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = pcVar12;
  uVar18 = (ulong)this & 0xffffffff;
  local_74._0_1_ = (byte)result;
  if (uVar18 != 0) {
    iVar11 = 3;
    uVar15 = 0;
    do {
      bVar3 = pcVar17[uVar15];
      uVar10 = (uint)bVar3;
      if ((4 < uVar10 - 9) && (uVar10 != 0x20)) {
        if (uVar10 == 0x2d) {
          uVar23 = uVar18 - uVar15;
          pcVar12 = (char *)0x0;
          uVar19 = 1;
          goto LAB_00cd9ad2;
        }
        if (bVar3 == 0x30 && uVar18 - 1 != uVar15) {
          cVar6 = pcVar17[uVar15 + 1];
          if (cVar6 != 'B') {
            if (cVar6 != 'x') {
              if (cVar6 == 'b') goto LAB_00cd9f6f;
              if (cVar6 != 'X') {
                pcVar12 = (char *)0x0;
                bVar25 = false;
                if (((byte)local_74 & (byte)(cVar6 - 0x30U) < 10) == 0) goto LAB_00cda097;
                goto LAB_00cd9b69;
              }
            }
            pcVar12 = (char *)0x0;
            uVar19 = 1;
            goto LAB_00cd9c09;
          }
LAB_00cd9f6f:
          uVar19 = ~uVar15 + uVar18;
          pcVar12 = (char *)0x0;
          bVar25 = uVar19 >= 2;
          if (uVar19 < 2) goto LAB_00cd9b69;
          uVar23 = 1;
          pcVar12 = (char *)0x0;
          goto LAB_00cd9f8a;
        }
LAB_00cda097:
        pcVar12 = (char *)0x0;
        bVar25 = false;
        if (((byte)local_74 & bVar3 == 0x2b) != 0) goto LAB_00cd9b69;
        local_70 = (undefined4 *)(uVar18 - uVar15);
        local_50 = (undefined4 *)(ulong)(bVar3 == 0x2b);
        pcVar12 = (char *)0x0;
        puVar16 = local_50;
        goto LAB_00cda0cc;
      }
      uVar15 = uVar15 + 1;
    } while (uVar18 != uVar15);
  }
  bVar25 = false;
  goto LAB_00cd9b69;
  while( true ) {
    uVar24 = uVar19 + 1;
    if ((int)pcVar12 < (int)(bVar3 + 0x80000000) / 10) {
      bVar26 = false;
    }
    else {
      pcVar12 = (char *)(ulong)((int)pcVar12 * 10 - (uint)bVar3);
      bVar26 = true;
      if ((~uVar19 + uVar18 != uVar15) &&
         (pcVar17[uVar15 + 1 + uVar19] == '_' && (byte)local_74 == 0)) {
        uVar24 = uVar19 + 2;
        if ((uVar18 - uVar19) - 2 == uVar15) {
          bVar26 = false;
        }
        else {
          bVar26 = (byte)(pcVar17[uVar15 + uVar24] - 0x30U) < 10;
        }
      }
    }
    bVar25 = false;
    uVar19 = uVar24;
    if (!bVar26) break;
LAB_00cd9ad2:
    if (uVar23 <= uVar19) goto LAB_00cd9de1;
    bVar3 = pcVar17[uVar15 + uVar19] - 0x30;
    if (9 < bVar3) {
      if (pcVar17[uVar15 + uVar19] == '.') {
        if ((byte)local_74 != 0) goto LAB_00cda671;
        uVar24 = uVar19 + 1;
        if (uVar24 < uVar23) {
          iVar11 = 0;
          if (9 < (byte)(pcVar17[uVar15 + 1 + uVar19] - 0x30U)) goto LAB_00cda430;
          iVar8 = 1;
        }
        else {
          iVar11 = 3;
LAB_00cda430:
          iVar8 = 1;
          if (1 < uVar19) {
            iVar8 = iVar11;
          }
        }
        uVar19 = uVar24;
        if (iVar8 == 3) goto LAB_00cd9de1;
        if (iVar8 != 0) goto LAB_00cda671;
      }
      bVar25 = false;
      if (((ulong)(byte)pcVar17[uVar15 + uVar19] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar19] & 0x3f) & 1) != 0)) {
        uVar24 = uVar19 + 1;
        uVar19 = uVar24;
        if (uVar23 <= uVar24) goto LAB_00cd9de1;
        goto LAB_00cda050;
      }
      break;
    }
  }
  goto LAB_00cd9b69;
  while (uVar24 = uVar24 + 1, uVar19 = uVar23, uVar23 != uVar24) {
LAB_00cda050:
    if ((0x20 < (ulong)(byte)pcVar17[uVar15 + uVar24]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar24] & 0x3f) & 1) == 0))
    goto LAB_00cda671;
  }
LAB_00cd9de1:
  bVar25 = 1 < uVar19;
  goto LAB_00cd9b69;
LAB_00cd9c09:
  do {
    if (~uVar15 + uVar18 <= uVar19) goto LAB_00cd9de1;
    bVar3 = pcVar17[uVar15 + 1 + uVar19];
    bVar14 = bVar3 | 0x20;
    if (0x19 < (byte)(bVar3 + 0xbf)) {
      bVar14 = bVar3;
    }
    if (9 < (byte)(bVar14 - 0x30)) {
      bVar25 = false;
      if ((0x25 < bVar14 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar14 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar6 = -0x57;
    if ((char)bVar14 < 'a') {
      cVar6 = -0x30;
    }
    uVar23 = uVar19 + 1;
    if (((uVar18 - uVar19) - 2 == uVar15) || (pcVar17[uVar15 + 2 + uVar19] != '_')) {
LAB_00cd9cd3:
      uVar10 = (byte)(cVar6 + bVar14) >> 4 ^ 0x7ffffff;
      iVar11 = (int)pcVar12;
      if (iVar11 <= (int)uVar10) {
        pcVar12 = (char *)(ulong)(iVar11 * 0x10 + (uint)(byte)(cVar6 + bVar14));
      }
      bVar26 = iVar11 <= (int)uVar10;
    }
    else {
      uVar23 = uVar19 + 2;
      if ((uVar18 - uVar19) - 3 != uVar15) {
        if (9 < (byte)(pcVar17[uVar15 + 3 + uVar19] - 0x30U)) {
          uVar10 = (byte)pcVar17[uVar15 + 3 + uVar19] - 0x41;
          bVar26 = false;
          if ((0x25 < uVar10) ||
             (bVar26 = false, (0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_00cd9cf5;
        }
        goto LAB_00cd9cd3;
      }
      bVar26 = false;
    }
LAB_00cd9cf5:
    bVar25 = false;
    uVar19 = uVar23;
  } while (bVar26);
  goto LAB_00cd9b69;
  while( true ) {
    uVar24 = uVar23 + 1;
    if (((uVar18 - uVar23) - 2 != uVar15) && (pcVar17[uVar15 + 2 + uVar23] == '_')) {
      if (((uVar18 - uVar23) - 3 == uVar15) || ((pcVar17[uVar15 + 3 + uVar23] & 0xfeU) != 0x30))
      goto LAB_00cda671;
      uVar24 = uVar23 + 2;
    }
    uVar23 = uVar24;
    if (0x3fffffff < (int)pcVar12) goto LAB_00cda671;
    pcVar12 = (char *)(ulong)(uint)(iVar11 + (int)pcVar12 * 2);
    bVar25 = true;
    if (uVar19 <= uVar23) break;
LAB_00cd9f8a:
    iVar11 = 0;
    if (pcVar17[uVar15 + 1 + uVar23] != '0') {
      if (pcVar17[uVar15 + 1 + uVar23] != '1') {
        bVar25 = false;
        break;
      }
      iVar11 = 1;
    }
  }
  goto LAB_00cd9b69;
  while( true ) {
    puVar21 = (undefined4 *)((long)puVar16 + 1);
    bVar26 = false;
    if ((int)pcVar12 <= (int)((bVar3 ^ 0x7ffffffe) / 10)) {
      pcVar12 = (char *)(ulong)((int)pcVar12 * 10 + (uint)bVar3);
      bVar26 = true;
      if ((~(ulong)puVar16 + uVar18 != uVar15) && (pcVar1[uVar15 + 1] == '_' && (byte)local_74 == 0)
         ) {
        puVar21 = (undefined4 *)((long)puVar16 + 2);
        if ((uVar18 - (long)puVar16) - 2 == uVar15) {
          bVar26 = false;
        }
        else {
          bVar26 = (byte)((pcVar17 + (long)puVar21)[uVar15] - 0x30U) < 10;
        }
      }
    }
    bVar25 = false;
    puVar16 = puVar21;
    if (!bVar26) break;
LAB_00cda0cc:
    if (local_70 <= puVar16) goto LAB_00cda26b;
    pcVar1 = (char *)((long)puVar16 + (long)pcVar17);
    bVar3 = pcVar1[uVar15] - 0x30;
    if (9 < bVar3) {
      if (pcVar1[uVar15] == '.') {
        if ((byte)local_74 != 0) goto LAB_00cda671;
        puVar21 = (undefined4 *)((long)puVar16 + 1);
        if ((puVar21 < local_70) && (iVar11 = 0, (byte)(pcVar1[uVar15 + 1] - 0x30U) < 10)) {
          iVar8 = 1;
        }
        else {
          iVar8 = 1;
          if (local_50 < puVar16) {
            iVar8 = iVar11;
          }
        }
        puVar16 = puVar21;
        if (iVar8 == 3) goto LAB_00cda26b;
        if (iVar8 != 0) goto LAB_00cda671;
      }
      bVar25 = false;
      if (((ulong)(byte)(pcVar17 + (long)puVar16)[uVar15] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)(pcVar17 + (long)puVar16)[uVar15] & 0x3f) & 1) != 0)) {
        puVar21 = (undefined4 *)((long)puVar16 + 1);
        puVar16 = puVar21;
        if (local_70 <= puVar21) goto LAB_00cda26b;
        goto LAB_00cda3fd;
      }
      break;
    }
  }
  goto LAB_00cd9b69;
LAB_00cda671:
  bVar25 = false;
  goto LAB_00cd9b69;
  while( true ) {
    puVar20 = (undefined4 *)((long)puVar21 + 1);
    if (local_68.result < (long)((ulong)bVar3 + 0x8000000000000000) / 10) {
      bVar25 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar3;
      bVar25 = true;
      if ((~(ulong)puVar21 + uVar18 != uVar15) &&
         (((char *)((long)puVar21 + (long)pcVar17))[uVar15 + 1] == '_' && (byte)local_74 == 0)) {
        puVar20 = (undefined4 *)((long)puVar21 + 2);
        if ((uVar18 - (long)puVar21) - 2 == uVar15) {
          bVar25 = false;
        }
        else {
          bVar25 = (byte)((pcVar17 + (long)puVar20)[uVar15] - 0x30U) < 10;
        }
      }
    }
    puVar21 = puVar20;
    if (!bVar25) break;
LAB_00cd9d38:
    if (puVar16 <= puVar21) goto LAB_00cda189;
    cVar6 = ((char *)((long)puVar21 + (long)pcVar17))[uVar15];
    bVar3 = cVar6 - 0x30;
    if (9 < bVar3) {
      if (cVar6 != '.') goto LAB_00cda381;
      if ((byte)local_74 == 0) {
        puVar20 = (undefined4 *)((long)puVar21 + 1);
        if (puVar16 <= puVar20) {
          iVar11 = 3;
          puVar22 = puVar20;
          goto LAB_00cda75d;
        }
        local_68.decimal = 0;
        puVar5 = puVar20;
        goto LAB_00cda1e5;
      }
      break;
    }
  }
  goto LAB_00cd9b9f;
  while (puVar5 = puVar22, puVar22 < puVar16) {
LAB_00cda1e5:
    bVar3 = ((char *)((long)puVar5 + (long)pcVar17))[uVar15] - 0x30;
    local_50 = puVar20;
    if (9 < bVar3) {
      iVar11 = 0;
      goto LAB_00cda748;
    }
    if (local_68.decimal <= (long)(((ulong)bVar3 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar3;
    }
    puVar22 = (undefined4 *)((long)puVar5 + 1);
    if (((~(ulong)puVar5 + uVar18 != uVar15) &&
        (((char *)((long)puVar5 + (long)pcVar17))[uVar15 + 1] == '_')) &&
       ((puVar22 = (undefined4 *)((long)puVar5 + 2), (uVar18 - (long)puVar5) - 2 == uVar15 ||
        (9 < (byte)((pcVar17 + (long)puVar22)[uVar15] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar8 = 1;
      local_70 = puVar9;
      goto LAB_00cda770;
    }
  }
  iVar11 = 3;
LAB_00cda748:
  local_68._18_6_ = 0;
  puVar22 = puVar5;
  local_70 = puVar9;
LAB_00cda75d:
  iVar8 = 1;
  if (puVar20 < puVar22) {
    iVar8 = iVar11;
  }
  if (&DAT_00000001 < puVar21) {
    iVar8 = iVar11;
  }
LAB_00cda770:
  puVar21 = puVar22;
  if (iVar8 == 3) {
LAB_00cda189:
    bVar25 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                       (&local_68);
    if (bVar25) {
      bVar26 = &DAT_00000001 < puVar21;
      goto LAB_00cd9ba1;
    }
  }
  else if (iVar8 == 0) {
LAB_00cda381:
    bVar3 = (pcVar17 + (long)puVar21)[uVar15];
    if (bVar3 - 9 < 5) {
LAB_00cda395:
      puVar20 = (undefined4 *)((long)puVar21 + 1);
      puVar21 = puVar20;
      if (puVar20 < puVar16) {
        do {
          if ((0x20 < (ulong)(byte)(pcVar17 + (long)puVar20)[uVar15]) ||
             ((0x100003e00U >> ((ulong)(byte)(pcVar17 + (long)puVar20)[uVar15] & 0x3f) & 1) == 0))
          goto LAB_00cd9b9f;
          puVar20 = (undefined4 *)((long)puVar20 + 1);
          puVar21 = puVar16;
        } while (puVar16 != puVar20);
      }
      goto LAB_00cda189;
    }
    if ((bVar3 == 0x65) || (bVar3 == 0x45)) {
      if ((puVar21 != (undefined4 *)&DAT_00000001 && (byte)local_74 == 0) &&
         ((undefined4 *)((long)puVar21 + 1) < puVar16)) {
        local_76.result = 0;
        pcVar17 = pcVar17 + (long)puVar21 + uVar15 + 1;
        iVar13 = ~uVar15 + (uVar18 - (long)puVar21);
        if (*pcVar17 == '-') {
          bVar25 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar17,iVar13,&local_76,false);
        }
        else {
          bVar25 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar17,iVar13,&local_76,false);
        }
        bVar26 = false;
        if (bVar25 != false) {
          bVar26 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<int>,true>
                             (&local_68,local_76.result);
        }
        goto LAB_00cd9ba1;
      }
    }
    else if (bVar3 == 0x20) goto LAB_00cda395;
  }
  goto LAB_00cd9b9f;
  while( true ) {
    uVar23 = uVar2;
    if (0x3fffffffffffffff < local_68.result) goto LAB_00cd9b9f;
    local_68.result = uVar24 + local_68.result * 2;
    if (uVar19 <= uVar23) break;
LAB_00cda2e9:
    if (pcVar17[uVar15 + 1 + uVar23] == '0') {
      uVar24 = 0;
    }
    else {
      uVar24 = 1;
      if (pcVar17[uVar15 + 1 + uVar23] != '1') goto LAB_00cd9b9f;
    }
    uVar2 = uVar23 + 1;
    if (((uVar18 - uVar23) - 2 != uVar15) && (pcVar17[uVar15 + 2 + uVar23] == '_')) {
      if (((uVar18 - uVar23) - 3 == uVar15) || ((pcVar17[uVar15 + 3 + uVar23] & 0xfeU) != 0x30))
      goto LAB_00cd9b9f;
      uVar2 = uVar23 + 2;
    }
  }
LAB_00cda363:
  bVar26 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     (&local_68);
  bVar26 = bVar26 && 1 < uVar19;
  goto LAB_00cd9ba1;
LAB_00cd9e7d:
  do {
    if (~uVar15 + uVar18 <= uVar19) {
      bVar26 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                         (&local_68);
      bVar26 = 1 < uVar19 && bVar26;
      goto LAB_00cd9ba1;
    }
    bVar3 = pcVar17[uVar15 + 1 + uVar19];
    bVar14 = bVar3 | 0x20;
    if (0x19 < (byte)(bVar3 + 0xbf)) {
      bVar14 = bVar3;
    }
    if ((9 < (byte)(bVar14 - 0x30)) &&
       ((0x25 < bVar14 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar14 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar6 = -0x57;
    if ((char)bVar14 < 'a') {
      cVar6 = -0x30;
    }
    uVar23 = uVar19 + 1;
    if (((uVar18 - uVar19) - 2 == uVar15) || (pcVar17[uVar15 + 2 + uVar19] != '_')) {
LAB_00cd9f35:
      uVar19 = (ulong)((byte)(cVar6 + bVar14) >> 4) ^ 0x7ffffffffffffff;
      lVar4 = local_68.result;
      if (local_68.result <= (long)uVar19) {
        lVar4 = local_68.result * 0x10 + (ulong)(byte)(cVar6 + bVar14);
      }
      bVar25 = local_68.result <= (long)uVar19;
      local_68.result = lVar4;
    }
    else {
      uVar23 = uVar19 + 2;
      if ((uVar18 - uVar19) - 3 != uVar15) {
        if (9 < (byte)(pcVar17[uVar15 + 3 + uVar19] - 0x30U)) {
          uVar10 = (byte)pcVar17[uVar15 + 3 + uVar19] - 0x41;
          bVar25 = false;
          if ((0x25 < uVar10) ||
             (bVar25 = false, (0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_00cd9f5c;
        }
        goto LAB_00cd9f35;
      }
      bVar25 = false;
    }
LAB_00cd9f5c:
    uVar19 = uVar23;
  } while (bVar25);
  goto LAB_00cd9b9f;
  while( true ) {
    cVar6 = ((char *)((long)puVar21 + (long)pcVar17))[uVar15];
    bVar3 = cVar6 - 0x30;
    if (9 < bVar3) {
      if (cVar6 != '.') goto LAB_00cda686;
      if ((byte)local_74 != 0) goto LAB_00cd9b9f;
      puVar20 = (undefined4 *)((long)puVar21 + 1);
      if (puVar16 <= puVar20) {
        iVar11 = 3;
        puVar22 = puVar20;
        goto LAB_00cda836;
      }
      local_68.decimal = 0;
      local_44 = 0;
      puVar5 = puVar20;
      goto LAB_00cda59f;
    }
    puVar20 = (undefined4 *)((long)puVar21 + 1);
    bVar25 = false;
    if (local_68.result <= (long)(((ulong)bVar3 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar3;
      bVar25 = true;
      if ((~(ulong)puVar21 + uVar18 != uVar15) &&
         (((char *)((long)puVar21 + (long)pcVar17))[uVar15 + 1] == '_' && (byte)local_74 == 0)) {
        puVar20 = (undefined4 *)((long)puVar21 + 2);
        if ((uVar18 - (long)puVar21) - 2 == uVar15) {
          bVar25 = false;
        }
        else {
          bVar25 = (byte)((pcVar17 + (long)puVar20)[uVar15] - 0x30U) < 10;
        }
      }
    }
    puVar21 = puVar20;
    local_70 = puVar9;
    if (!bVar25) break;
LAB_00cda487:
    if (puVar16 <= puVar21) goto LAB_00cda544;
  }
  goto LAB_00cda85b;
  while (puVar5 = puVar22, puVar22 < puVar16) {
LAB_00cda59f:
    bVar3 = ((char *)((long)puVar5 + (long)pcVar17))[uVar15] - 0x30;
    if (9 < bVar3) {
      iVar11 = 0;
      goto LAB_00cda828;
    }
    if (local_68.decimal <= (long)(((ulong)bVar3 ^ 0x7ffffffffffffffe) / 10)) {
      local_44 = local_44 + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar3;
    }
    puVar22 = (undefined4 *)((long)puVar5 + 1);
    if (((~(ulong)puVar5 + uVar18 != uVar15) &&
        (((char *)((long)puVar5 + (long)pcVar17))[uVar15 + 1] == '_')) &&
       ((puVar22 = (undefined4 *)((long)puVar5 + 2), (uVar18 - (long)puVar5) - 2 == uVar15 ||
        (9 < (byte)((pcVar17 + (long)puVar22)[uVar15] - 0x30U))))) {
      local_68._18_6_ = 0;
      local_68.decimal_digits = (ushort)local_44;
      iVar8 = 1;
      goto LAB_00cda84a;
    }
  }
  iVar11 = 3;
LAB_00cda828:
  local_68._18_6_ = 0;
  local_68.decimal_digits = (ushort)local_44;
  puVar22 = puVar5;
LAB_00cda836:
  iVar8 = 1;
  if (puVar20 < puVar22) {
    iVar8 = iVar11;
  }
  if (local_50 < puVar21) {
    iVar8 = iVar11;
  }
LAB_00cda84a:
  puVar21 = puVar22;
  if (iVar8 == 3) {
LAB_00cda544:
    local_70 = puVar9;
    bVar25 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                       (&local_68);
    if (bVar25) {
      bVar26 = local_50 < puVar21;
      puVar9 = local_70;
      goto LAB_00cd9ba1;
    }
  }
  else {
    local_70 = puVar9;
    if (iVar8 == 0) {
LAB_00cda686:
      bVar3 = (pcVar17 + (long)puVar21)[uVar15];
      if (bVar3 - 9 < 5) {
LAB_00cda69a:
        puVar20 = (undefined4 *)((long)puVar21 + 1);
        puVar21 = puVar20;
        if (puVar20 < puVar16) {
          do {
            local_70 = puVar9;
            if ((0x20 < (ulong)(byte)(pcVar17 + (long)puVar20)[uVar15]) ||
               ((0x100003e00U >> ((ulong)(byte)(pcVar17 + (long)puVar20)[uVar15] & 0x3f) & 1) == 0))
            goto LAB_00cda85b;
            puVar20 = (undefined4 *)((long)puVar20 + 1);
            puVar21 = puVar16;
          } while (puVar16 != puVar20);
        }
        goto LAB_00cda544;
      }
      if ((bVar3 == 0x65) || (bVar3 == 0x45)) {
        local_70 = puVar9;
        if ((puVar21 != local_50 && (byte)local_74 == 0) &&
           ((undefined4 *)((long)puVar21 + 1) < puVar16)) {
          local_76.result = 0;
          pcVar17 = pcVar17 + (long)puVar21 + uVar15 + 1;
          iVar13 = ~uVar15 + (uVar18 - (long)puVar21);
          if (*pcVar17 == '-') {
            bVar25 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar17,iVar13,&local_76,false);
          }
          else {
            bVar25 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar17,iVar13,&local_76,false);
          }
          bVar26 = false;
          puVar9 = local_70;
          if (bVar25 != false) {
            bVar26 = IntegerDecimalCastOperation::
                     HandleExponent<duckdb::IntegerDecimalCastData<int>,false>
                               (&local_68,local_76.result);
            puVar9 = local_70;
          }
          goto LAB_00cd9ba1;
        }
      }
      else {
        local_70 = puVar9;
        if (bVar3 == 0x20) goto LAB_00cda69a;
      }
    }
  }
LAB_00cda85b:
  bVar26 = false;
  puVar9 = local_70;
  goto LAB_00cd9ba1;
  while (puVar21 = (undefined4 *)((long)puVar21 + 1), puVar16 = local_70, local_70 != puVar21) {
LAB_00cda3fd:
    if ((0x20 < (ulong)(byte)(pcVar17 + (long)puVar21)[uVar15]) ||
       ((0x100003e00U >> ((ulong)(byte)(pcVar17 + (long)puVar21)[uVar15] & 0x3f) & 1) == 0))
    goto LAB_00cda671;
  }
LAB_00cda26b:
  bVar25 = local_50 < puVar16;
LAB_00cd9b69:
  if (bVar25) {
    *puVar9 = (int)pcVar12;
    bVar26 = true;
  }
  else {
    if (uVar18 != 0) {
      uVar15 = 0;
      do {
        bVar3 = pcVar17[uVar15];
        if ((0x20 < (ulong)bVar3) || ((0x100003e00U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          puVar16 = (undefined4 *)(uVar18 - uVar15);
          local_68.decimal_digits = 0;
          local_74 = uVar7;
          input_local.value._0_8_ = this;
          if (bVar3 == 0x2d) {
            local_68.result = 0;
            puVar21 = (undefined4 *)&DAT_00000001;
            goto LAB_00cd9d38;
          }
          if (bVar3 == 0x30 && uVar18 - 1 != uVar15) {
            cVar6 = pcVar17[uVar15 + 1];
            if (cVar6 == 'B') {
LAB_00cda2c1:
              uVar19 = ~uVar15 + uVar18;
              if (uVar19 < 2) goto LAB_00cda363;
              local_68.result = 0;
              uVar23 = 1;
              goto LAB_00cda2e9;
            }
            if (cVar6 != 'x') {
              if (cVar6 == 'b') goto LAB_00cda2c1;
              if (cVar6 != 'X') {
                if (((byte)local_74 & (byte)(cVar6 - 0x30U) < 10) == 0) goto LAB_00cda463;
                break;
              }
            }
            local_68.result = 0;
            uVar19 = 1;
            goto LAB_00cd9e7d;
          }
LAB_00cda463:
          if (((byte)local_74 & bVar3 == 0x2b) == 0) {
            local_50 = (undefined4 *)(ulong)(bVar3 == 0x2b);
            local_68.result = 0;
            puVar21 = local_50;
            goto LAB_00cda487;
          }
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
LAB_00cd9b9f:
    bVar26 = false;
LAB_00cd9ba1:
    if (bVar26 != false) {
      *puVar9 = (undefined4)local_68.result;
    }
  }
  return bVar26;
}

Assistant:

bool TryCast::Operation(string_t input, int32_t &result, bool strict) {
	return TrySimpleIntegerCast<int32_t>(input.GetData(), input.GetSize(), result, strict);
}